

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall soul::AST::Graph::addProcessorInstance(Graph *this,ProcessorInstance *newInstance)

{
  bool bVar1;
  ProcessorInstance *pPVar2;
  UnqualifiedName *pUVar3;
  UnqualifiedName *pUVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pool_ref<soul::AST::ProcessorInstance> local_b0;
  undefined1 local_a6;
  undefined1 local_a5;
  string local_98;
  undefined1 local_71;
  CompileMessage local_70;
  reference local_38;
  pool_ref<soul::AST::ProcessorInstance> *i;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
  *__range2;
  ProcessorInstance *newInstance_local;
  Graph *this_local;
  
  __end2 = std::
           vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ::begin(&this->processorInstances);
  i = (pool_ref<soul::AST::ProcessorInstance> *)
      std::
      vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
      ::end(&this->processorInstances);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
                                *)&i);
    if (!bVar1) {
      pool_ref<soul::AST::ProcessorInstance>::pool_ref<soul::AST::ProcessorInstance,void>
                (&local_b0,newInstance);
      std::
      vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
      ::push_back(&this->processorInstances,&local_b0);
      pool_ref<soul::AST::ProcessorInstance>::~pool_ref(&local_b0);
      return;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
               ::operator*(&__end2);
    pPVar2 = pool_ref<soul::AST::ProcessorInstance>::operator->(local_38);
    pUVar3 = pool_ptr<soul::AST::UnqualifiedName>::operator*(&pPVar2->instanceName);
    pUVar4 = pool_ptr<soul::AST::UnqualifiedName>::operator*(&newInstance->instanceName);
    bVar1 = UnqualifiedName::operator==(pUVar3,pUVar4);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
    ::operator++(&__end2);
  }
  pUVar3 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&newInstance->instanceName);
  bVar1 = ProcessorInstance::isImplicitlyCreated(newInstance);
  local_71 = 0;
  local_a5 = 0;
  local_a6 = 0;
  if (bVar1) {
    Errors::cannotReuseImplicitProcessorInstance<>();
    local_71 = 1;
  }
  else {
    pUVar4 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&newInstance->instanceName);
    UnqualifiedName::toString_abi_cxx11_(&local_98,pUVar4);
    local_a5 = 1;
    Errors::nameInUse<std::__cxx11::string>(&local_70,(Errors *)&local_98,args);
    local_a6 = 1;
  }
  Context::throwError(&(pUVar3->super_Expression).super_Statement.super_ASTObject.context,&local_70,
                      false);
}

Assistant:

void addProcessorInstance (ProcessorInstance& newInstance)
        {
            for (auto& i : processorInstances)
                if (*i->instanceName == *newInstance.instanceName)
                    newInstance.instanceName->context.throwError (newInstance.isImplicitlyCreated()
                                                                    ? Errors::cannotReuseImplicitProcessorInstance()
                                                                    : Errors::nameInUse (newInstance.instanceName->toString()));

            processorInstances.push_back (newInstance);
        }